

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

tmbstr ParseValue(TidyDocImpl *doc,ctmbstr name,Bool foldCase,Bool *isempty,int *pdelim)

{
  Lexer *lexer;
  Lexer *lexer_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Bool BVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  tmbstr ptVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  StreamIn *in;
  long lVar16;
  uint uVar17;
  StreamIn **ppSVar18;
  long lVar19;
  bool bVar20;
  
  lexer = doc->lexer;
  *pdelim = 0x22;
  iVar10 = *(int *)((doc->config).value + 0x2c);
  while( true ) {
    uVar2 = prvTidyReadChar(doc->docIn);
    if (uVar2 == 0xffffffff) break;
    if ((0x7f < uVar2) || ((lexmap[uVar2] & 8) == 0)) goto LAB_00147e48;
  }
  prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_00147e48:
  ppSVar18 = &doc->docIn;
  if ((uVar2 < 0x3e) && ((0x2000008400000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
    while (uVar2 = prvTidyReadChar(*ppSVar18), uVar2 != 0xffffffff) {
      if ((0x7f < uVar2) || ((lexmap[uVar2] & 8) == 0)) goto LAB_00147ea1;
    }
    prvTidyUngetChar(0xffffffff,*ppSVar18);
LAB_00147ea1:
    if ((uVar2 != 0x22) && (uVar2 != 0x27)) {
      if (uVar2 == 0x3c) {
        uVar2 = lexer->lexsize;
        prvTidyAddCharToLexer(lexer,0x3c);
        lexer_00 = doc->lexer;
        uVar3 = prvTidyReadChar(doc->docIn);
        prvTidyAddCharToLexer(lexer_00,uVar3);
        iVar10 = 0x22;
        uVar14 = uVar3 - 0x25;
        while (uVar3 = prvTidyReadChar(*ppSVar18), uVar3 != 0xffffffff) {
          if (uVar3 == 0x3e) {
            if ((uVar14 < 0x1c) && ((0xc000001U >> (uVar14 & 0x1f) & 1) != 0)) {
              prvTidyAddCharToLexer(lexer_00,0x3e);
            }
            else {
              prvTidyUngetChar(0x3e,*ppSVar18);
            }
            break;
          }
          if ((((0x1b < uVar14) || ((0xc000001U >> (uVar14 & 0x1f) & 1) == 0)) && (uVar3 < 0x80)) &&
             ((lexmap[uVar3] & 8) != 0)) break;
          prvTidyAddCharToLexer(lexer_00,uVar3);
          if (uVar3 == 0x27) {
            do {
              uVar3 = prvTidyReadChar(*ppSVar18);
              if (uVar3 == 0x3e) goto LAB_0014849d;
              if (uVar3 == 0xffffffff) goto LAB_00148474;
              prvTidyAddCharToLexer(lexer_00,uVar3);
            } while (uVar3 != 0x27);
          }
          else if (uVar3 == 0x22) {
            do {
              uVar3 = prvTidyReadChar(*ppSVar18);
              if (uVar3 == 0x3e) goto LAB_0014849d;
              if (uVar3 == 0xffffffff) goto LAB_00148474;
              prvTidyAddCharToLexer(lexer_00,uVar3);
              iVar10 = 0x27;
            } while (uVar3 != 0x22);
          }
        }
LAB_001484c9:
        *pdelim = iVar10;
        uVar3 = lexer->lexsize - uVar2;
        lexer->lexsize = uVar2;
        if (0 < (int)uVar3) {
          ptVar12 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (int)uVar2,uVar3);
          return ptVar12;
        }
        goto LAB_00148505;
      }
      prvTidyUngetChar(uVar2,*ppSVar18);
      uVar2 = 0;
    }
    uVar3 = lexer->lexsize;
    uVar4 = prvTidyReadChar(*ppSVar18);
    if (uVar4 == 0xffffffff) {
      bVar1 = false;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      uVar17 = 0;
      bVar1 = false;
      do {
        bVar20 = bVar1;
        if (uVar2 == 0) {
          if ((uVar4 != 0x22) && (uVar4 != 0x27)) {
            if (uVar4 != 0x3e) goto LAB_001480c4;
LAB_00148582:
            in = *ppSVar18;
            uVar4 = 0x3e;
            goto LAB_0014829f;
          }
          uVar5 = prvTidyReadChar(*ppSVar18);
          uVar7 = uVar5;
          if (uVar5 == 0x3e) {
            prvTidyAddCharToLexer(lexer,uVar4);
            uVar4 = 0x3e;
            uVar7 = 0x3e;
          }
          prvTidyUngetChar(uVar7,*ppSVar18);
          if (uVar5 == 0x3e) goto LAB_001482a4;
LAB_001480c4:
          if (uVar4 == 0x2f) {
            uVar4 = prvTidyReadChar(*ppSVar18);
            if ((uVar4 == 0x3e) && (BVar8 = prvTidyIsUrl(doc,name), BVar8 == no)) {
              *isempty = yes;
              goto LAB_00148582;
            }
            prvTidyUngetChar(uVar4,*ppSVar18);
            uVar4 = 0x2f;
          }
          else if (uVar4 == 0x3c) {
            prvTidyUngetChar(0x3c,doc->docIn);
            prvTidyUngetChar(0x3e,doc->docIn);
            prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x289);
            goto LAB_001482a4;
          }
        }
        else {
          if (uVar4 == uVar2) goto LAB_001482a4;
          if ((uVar4 < 0x3f) && ((0x5000000000000400U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
            uVar14 = uVar14 + 1;
          }
          bVar20 = true;
          if (uVar4 != 0x3e) {
            bVar20 = bVar1;
          }
        }
        bVar1 = bVar20;
        if (uVar4 != 0x5c) {
          if (uVar4 != 0x26) goto LAB_00148185;
          uVar17 = 0x26;
          prvTidyAddCharToLexer(lexer,0x26);
          ParseEntity(doc,IgnoreWhitespace);
          uVar6 = lexer->lexsize - 1;
          if (((iVar10 == 0) && (lexer->lexsize != 0)) && (lexer->lexbuf[uVar6] == '\n')) {
            lexer->lexbuf[uVar6] = ' ';
          }
          goto LAB_001481ef;
        }
        uVar7 = prvTidyReadChar(*ppSVar18);
        uVar4 = 10;
        if (uVar7 != 10) {
          prvTidyUngetChar(uVar7,*ppSVar18);
          uVar4 = 0x5c;
        }
LAB_00148185:
        if ((uVar4 < 0x80) && ((lexmap[uVar4] & 8) != 0)) {
          if (uVar2 == 0) goto LAB_001482a4;
          if (iVar10 != 0) goto LAB_001481e2;
          if ((uVar4 == 10) && (BVar8 = prvTidyIsUrl(doc,name), BVar8 != no)) {
            prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x266);
            uVar17 = 10;
          }
          else {
            uVar4 = 0x20;
            if (uVar17 != 0x20) goto LAB_001481e2;
            BVar8 = prvTidyIsUrl(doc,name);
            uVar17 = 0x20;
            if (BVar8 != no) {
              prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x290);
            }
          }
        }
        else {
          if ((foldCase != no) && ((uVar4 < 0x80 && ((lexmap[uVar4] & 0x40) != 0)))) {
            bVar20 = true;
            if (uVar4 < 0x80) {
              bVar20 = (lexmap[uVar4] & 0x40) == 0;
            }
            if (!bVar20) {
              uVar4 = uVar4 + 0x20;
            }
          }
LAB_001481e2:
          prvTidyAddCharToLexer(lexer,uVar4);
          uVar17 = uVar4;
        }
LAB_001481ef:
        uVar4 = prvTidyReadChar(*ppSVar18);
      } while (uVar4 != 0xffffffff);
    }
    prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x283);
    in = doc->docIn;
    uVar4 = 0xffffffff;
LAB_0014829f:
    prvTidyUngetChar(uVar4,in);
LAB_001482a4:
    lVar19 = (long)(int)uVar3;
    if ((((iVar10 == 0) && (10 < uVar14)) &&
        ((bVar1 && (BVar8 = prvTidyIsScript(doc,name), BVar8 == no)))) &&
       (((BVar8 = prvTidyIsUrl(doc,name), BVar8 == no ||
         (iVar9 = prvTidytmbstrncmp(lexer->lexbuf + lVar19,"javascript:",0xb), iVar9 != 0)) &&
        (iVar9 = prvTidytmbstrncmp(lexer->lexbuf + lVar19,"<xml ",5), iVar9 != 0)))) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27d);
    }
    uVar4 = lexer->lexsize - uVar3;
    lexer->lexsize = uVar3;
    if ((uVar2 == 0) && ((int)uVar4 < 1)) {
      ptVar12 = (tmbstr)0x0;
    }
    else {
      if (((iVar10 == 0) &&
          (((0 < (int)uVar4 && (iVar10 = prvTidytmbstrcasecmp(name,"alt"), iVar10 != 0)) &&
           (iVar10 = prvTidytmbstrcasecmp(name,"title"), iVar10 != 0)))) &&
         ((iVar10 = prvTidytmbstrcasecmp(name,"value"), iVar10 != 0 &&
          (iVar10 = prvTidytmbstrcasecmp(name,"prompt"), iVar10 != 0)))) {
        uVar13 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        do {
          lVar16 = (long)lexer->lexbuf[uVar13 + lVar19 + -1];
          if (lVar16 < 0) {
            bVar15 = 0;
          }
          else {
            bVar15 = ((byte)lexmap[lVar16] & 8) >> 3;
          }
          uVar4 = uVar4 - 1;
        } while ((0 < (long)uVar13) && (uVar13 = uVar13 - 1, bVar15 != 0));
        pcVar11 = lexer->lexbuf + lVar19;
        while( true ) {
          if ((long)*pcVar11 < 0) {
            bVar15 = 0;
          }
          else {
            bVar15 = ((byte)lexmap[*pcVar11] & 8) >> 3;
          }
          if ((bVar15 == 0) || ((int)uVar4 < 1)) break;
          uVar4 = uVar4 - 1;
          uVar3 = uVar3 + 1;
          pcVar11 = pcVar11 + 1;
        }
      }
      ptVar12 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (int)uVar3,uVar4);
    }
    *pdelim = uVar2;
  }
  else {
    prvTidyUngetChar(uVar2,*ppSVar18);
LAB_00148505:
    ptVar12 = (tmbstr)0x0;
  }
  return ptVar12;
LAB_0014849d:
  prvTidyUngetChar(0x3e,doc->docIn);
  iVar10 = 0;
  prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
  goto LAB_001484c9;
LAB_00148474:
  iVar10 = 0;
  prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
  prvTidyUngetChar(0xffffffff,doc->docIn);
  goto LAB_001484c9;
}

Assistant:

static tmbstr ParseValue( TidyDocImpl* doc, ctmbstr name,
                          Bool foldCase, Bool *isempty, int *pdelim)
{
    Lexer* lexer = doc->lexer;
    int len = 0, start;
    Bool seen_gt = no;
    Bool munge = yes;
    uint c, lastc, delim, quotewarning;
    tmbstr value;

    delim = (tmbchar) 0;
    *pdelim = '"';

    /*
     Henry Zrepa reports that some folk are using the
     embed element with script attributes where newlines
     are significant and must be preserved
    */
    if ( cfgBool(doc, TidyLiteralAttribs) )
        munge = no;

 /* skip white space before the '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

/*
  c should be '=' if there is a value
  other legal possibilities are white
  space, '/' and '>'
*/

    if (c != '=' && c != '"' && c != '\'')
    {
        TY_(UngetChar)(c, doc->docIn);
        return NULL;
    }

 /* skip white space after '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

 /* check for quote marks */

    if (c == '"' || c == '\'')
        delim = c;
    else if (c == '<')
    {
        start = lexer->lexsize;
        TY_(AddCharToLexer)(lexer, c);
        *pdelim = ParseServerInstruction( doc );
        len = lexer->lexsize - start;
        lexer->lexsize = start;
        return (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                          lexer->lexbuf+start, len) : NULL);
    }
    else
        TY_(UngetChar)(c, doc->docIn);

 /*
   and read the value string
   check for quote mark if needed
 */

    quotewarning = 0;
    start = lexer->lexsize;
    c = '\0';

    for (;;)
    {
        lastc = c;  /* track last character */
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (delim == (tmbchar)0)
        {
            if (c == '>')
            {
                TY_(UngetChar)(c, doc->docIn);
                break;
            }

            if (c == '"' || c == '\'')
            {
                uint q = c;

                /* handle <input onclick=s("btn1")> and <a title=foo""">...</a> */
                /* this doesn't handle <a title=foo"/> which browsers treat as  */
                /* 'foo"/' nor  <a title=foo" /> which browser treat as 'foo"'  */
                
                c = TY_(ReadChar)(doc->docIn);
                if (c == '>')
                {
                    TY_(AddCharToLexer)(lexer, q);
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }
                else
                {
                    TY_(UngetChar)(c, doc->docIn);
                    c = q;
                }
            }

            if (c == '<')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '>';
                TY_(UngetChar)(c, doc->docIn);
                TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
                break;
            }

            /*
             For cases like <br clear=all/> need to avoid treating /> as
             part of the attribute value, however care is needed to avoid
             so treating <a href=http://www.acme.com/> in this way, which
             would map the <a> tag to <a href="http://www.acme.com"/>
            */
            if (c == '/')
            {
                /* peek ahead in case of /> */
                c = TY_(ReadChar)(doc->docIn);

                if ( c == '>' && !TY_(IsUrl)(doc, name) )
                {
                    *isempty = yes;
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }

                /* unget peeked character */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';
            }
        }
        else  /* delim is '\'' or '"' */
        {
            if (c == delim)
                break;

            if (c == '\n' || c == '<' || c == '>')
                ++quotewarning;

            if (c == '>')
                seen_gt = yes;
        }

        if (c == '&')
        {
            TY_(AddCharToLexer)(lexer, c);
            ParseEntity( doc, IgnoreWhitespace );
            if (lexer->lexbuf[lexer->lexsize - 1] == '\n' && munge)
                ChangeChar(lexer, ' ');
            continue;
        }

        /*
         kludge for JavaScript attribute values
         with line continuations in string literals
        */
        if (c == '\\')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c != '\n')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '\\';
            }
        }

        if (TY_(IsWhite)(c))
        {
            if ( delim == 0 )
                break;

            if (munge)
            {
                /* discard line breaks in quoted URLs */ 
                /* #438650 - fix by Randy Waki */
                if ( c == '\n' && TY_(IsUrl)(doc, name) )
                {
                    /* warn that we discard this newline */
                    TY_(ReportAttrError)( doc, lexer->token, NULL, NEWLINE_IN_URI);
                    continue;
                }
                
                c = ' ';

                if (lastc == ' ')
                {
                    if (TY_(IsUrl)(doc, name) )
                        TY_(ReportAttrError)( doc, lexer->token, NULL, WHITE_IN_URI);
                    continue;
                }
            }
        }
        else if (foldCase && TY_(IsUpper)(c))
            c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    if (quotewarning > 10 && seen_gt && munge)
    {
        /*
           there is almost certainly a missing trailing quote mark
           as we have see too many newlines, < or > characters.

           an exception is made for Javascript attributes and the
           javascript URL scheme which may legitimately include < and >,
           and for attributes starting with "<xml " as generated by
           Microsoft Office.
        */
        if ( !TY_(IsScript)(doc, name) &&
             !(TY_(IsUrl)(doc, name) && TY_(tmbstrncmp)(lexer->lexbuf+start, "javascript:", 11) == 0) &&
             !(TY_(tmbstrncmp)(lexer->lexbuf+start, "<xml ", 5) == 0)
           )
            TY_(Report)( doc, NULL, NULL, SUSPECTED_MISSING_QUOTE ); 
    }

    len = lexer->lexsize - start;
    lexer->lexsize = start;


    if (len > 0 || delim)
    {
        /* ignore leading and trailing white space for all but title, alt, value */
        /* and prompts attributes unless --literal-attributes is set to yes      */
        /* #994841 - Whitespace is removed from value attributes                 */

        /* Issue #217 - Also only if/while (len > 0) - MUST NEVER GO NEGATIVE! */
        if ((len > 0) && munge &&
            TY_(tmbstrcasecmp)(name, "alt") &&
            TY_(tmbstrcasecmp)(name, "title") &&
            TY_(tmbstrcasecmp)(name, "value") &&
            TY_(tmbstrcasecmp)(name, "prompt"))
        {
            while (TY_(IsWhite)(lexer->lexbuf[start+len-1]) && (len > 0))
                --len;

            /* Issue #497 - Fix leading space trimming */
            while (TY_(IsWhite)(lexer->lexbuf[start]) && (len > 0))
            {
                ++start;
                --len;
            }
        }

        value = TY_(tmbstrndup)(doc->allocator, lexer->lexbuf + start, len);
    }
    else
        value = NULL;

    /* note delimiter if given */
    *pdelim = delim;

    return value;
}